

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  long lVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  byte bVar4;
  u8 uVar5;
  short sVar6;
  Vdbe *p;
  Table *pTVar7;
  WhereLoop *p_00;
  sqlite3 *db;
  SrcList *pSVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Expr *pEVar15;
  Index *pIdx;
  CollSeq *pCVar16;
  uint uVar17;
  int iVar18;
  WhereTerm *pWVar19;
  char *pcVar20;
  Op *pOVar21;
  WhereTerm *pWVar22;
  int regOut;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar30;
  ulong uVar29;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar35;
  ulong uVar34;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint uVar41;
  uint uVar43;
  uint uVar44;
  undefined1 auVar42 [16];
  uint uVar45;
  undefined1 auVar46 [16];
  ulong uVar47;
  ulong uVar48;
  Expr *local_b8;
  char *zNotUsed;
  code *local_58;
  code *local_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  p = pParse->pVdbe;
  iVar11 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  pTVar7 = pSrc->pTab;
  pWVar22 = pWC->a;
  pWVar19 = pWVar22 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar28 = 0;
    uVar24 = 0xffffffffffffffff;
    local_b8 = (Expr *)0x0;
  }
  else {
    uVar28 = 0;
    uVar24 = 0;
    bVar9 = false;
    local_b8 = (Expr *)0x0;
    do {
      if (((p_00->prereq == 0) && ((pWVar22->wtFlags & 2) == 0)) &&
         (pEVar15 = pWVar22->pExpr, (pEVar15->flags & 1) == 0)) {
        local_38.n = pSrc->iCursor;
        local_3c = '\x03';
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        walkExpr((Walker *)&zNotUsed,pEVar15);
        if (local_3c != '\0') {
          db = pParse->db;
          pEVar15 = exprDup(db,pEVar15,0,(u8 **)0x0);
          local_b8 = sqlite3ExprAnd(db,local_b8,pEVar15);
        }
      }
      iVar12 = termCanDriveIndex(pWVar22,pSrc,notReady);
      if (iVar12 != 0) {
        iVar12 = (pWVar22->u).leftColumn;
        uVar26 = 1L << ((byte)iVar12 & 0x3f);
        if (0x3f < (long)iVar12) {
          uVar26 = 0x8000000000000000;
        }
        if (!bVar9) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar7->zName,pTVar7->aCol[iVar12].zName);
        }
        bVar9 = true;
        if ((uVar26 & uVar24) == 0) {
          iVar12 = whereLoopResize(pParse->db,p_00,uVar28 + 1);
          if (iVar12 != 0) goto LAB_00180031;
          p_00->aLTerm[(int)uVar28] = pWVar22;
          uVar24 = uVar24 | uVar26;
          bVar9 = true;
          uVar28 = uVar28 + 1;
        }
      }
      pWVar22 = pWVar22 + 1;
    } while (pWVar22 < pWVar19);
    uVar24 = ~uVar24 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)uVar28;
  (p_00->u).btree.nEq = (u16)uVar28;
  p_00->wsFlags = 0x4241;
  uVar24 = uVar24 & pSrc->colUsed;
  sVar6 = pTVar7->nCol;
  uVar23 = (uint)sVar6;
  uVar17 = 0x3f;
  if (sVar6 < 0x3f) {
    uVar17 = uVar23;
  }
  if (0 < (int)uVar23) {
    uVar26 = (ulong)(uVar17 + 3 & 0x7c);
    lVar1 = (ulong)uVar17 - 1;
    auVar37._8_4_ = (int)lVar1;
    auVar37._0_8_ = lVar1;
    auVar37._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar40._8_4_ = (int)uVar24;
    auVar40._0_8_ = uVar24;
    auVar40._12_4_ = (int)(uVar24 >> 0x20);
    auVar42 = _DAT_001df1e0;
    auVar46 = _DAT_001df1f0;
    uVar31 = 0;
    uVar33 = 0;
    uVar36 = 0;
    do {
      uVar35 = uVar36;
      uVar32 = uVar33;
      uVar30 = uVar31;
      uVar27 = uVar28;
      auVar38 = auVar46;
      auVar39 = auVar42;
      uVar47 = 1L << auVar39._0_8_ & uVar24;
      uVar48 = 1L << auVar39._8_8_ & auVar40._8_8_;
      uVar29 = 1L << auVar38._0_8_ & uVar24;
      uVar34 = 1L << auVar38._8_8_ & auVar40._8_8_;
      uVar28 = (uVar27 - ((int)(uVar29 >> 0x20) == 0 && (int)uVar29 == 0)) + 1;
      uVar31 = (uVar30 - ((int)uVar34 == 0 && (int)(uVar34 >> 0x20) == 0)) + 1;
      uVar33 = (uVar32 - ((int)(uVar47 >> 0x20) == 0 && (int)uVar47 == 0)) + 1;
      uVar36 = (uVar35 - ((int)uVar48 == 0 && (int)(uVar48 >> 0x20) == 0)) + 1;
      auVar46._0_8_ = auVar38._0_8_ + 4;
      auVar46._8_8_ = auVar38._8_8_ + 4;
      auVar42._0_8_ = auVar39._0_8_ + 4;
      auVar42._8_8_ = auVar39._8_8_ + 4;
      uVar26 = uVar26 - 4;
    } while (uVar26 != 0);
    auVar37 = auVar37 ^ _DAT_001d5060;
    auVar38 = auVar38 ^ _DAT_001d5060;
    iVar12 = auVar37._4_4_;
    iVar13 = auVar37._12_4_;
    auVar39 = auVar39 ^ _DAT_001d5060;
    uVar41 = -(uint)(iVar12 < auVar38._4_4_ ||
                    auVar38._4_4_ == iVar12 && auVar37._0_4_ < auVar38._0_4_);
    uVar43 = -(uint)(iVar13 < auVar38._12_4_ ||
                    auVar38._12_4_ == iVar13 && auVar37._8_4_ < auVar38._8_4_);
    uVar44 = -(uint)(iVar12 < auVar39._4_4_ ||
                    auVar39._4_4_ == iVar12 && auVar37._0_4_ < auVar39._0_4_);
    uVar45 = -(uint)(iVar13 < auVar39._12_4_ ||
                    auVar39._12_4_ == iVar13 && auVar37._8_4_ < auVar39._8_4_);
    uVar28 = (~uVar45 & uVar36 | uVar35 & uVar45) + (~uVar43 & uVar31 | uVar30 & uVar43) +
             (~uVar44 & uVar33 | uVar32 & uVar44) + (~uVar41 & uVar28 | uVar27 & uVar41);
  }
  iVar12 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar12 = uVar23 - 0x3e;
  }
  uVar26 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar12 + uVar28),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar7;
    pWVar22 = pWC->a;
    if (pWVar22 < pWVar19) {
      uVar26 = 0;
      uVar29 = 0;
      do {
        iVar13 = termCanDriveIndex(pWVar22,pSrc,notReady);
        if (iVar13 != 0) {
          iVar13 = (pWVar22->u).leftColumn;
          uVar34 = 1L << ((byte)iVar13 & 0x3f);
          if (0x3f < iVar13) {
            uVar34 = 0x8000000000000000;
          }
          if ((uVar34 & uVar29) == 0) {
            pEVar15 = pWVar22->pExpr;
            iVar18 = (int)uVar26;
            pIdx->aiColumn[iVar18] = (i16)iVar13;
            pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pEVar15->pLeft,pEVar15->pRight);
            pcVar20 = "BINARY";
            if (pCVar16 != (CollSeq *)0x0) {
              pcVar20 = pCVar16->zName;
            }
            uVar29 = uVar29 | uVar34;
            pIdx->azColl[iVar18] = pcVar20;
            uVar26 = (ulong)(iVar18 + 1);
          }
        }
        pWVar22 = pWVar22 + 1;
      } while (pWVar22 < pWVar19);
    }
    if (0 < sVar6) {
      uVar29 = 0;
      do {
        if ((uVar24 >> (uVar29 & 0x3f) & 1) != 0) {
          iVar13 = (int)uVar26;
          pIdx->aiColumn[iVar13] = (i16)uVar29;
          pIdx->azColl[iVar13] = "BINARY";
          uVar26 = (ulong)(iVar13 + 1);
        }
        uVar29 = uVar29 + 1;
      } while (uVar17 != uVar29);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar7->nCol)) {
      uVar26 = (ulong)(int)uVar26;
      iVar13 = 0x3f;
      do {
        pIdx->aiColumn[uVar26] = (i16)iVar13;
        pIdx->azColl[uVar26] = "BINARY";
        uVar26 = uVar26 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar13 < pTVar7->nCol);
    }
    iVar25 = (int)uVar26;
    pIdx->aiColumn[iVar25] = -1;
    pIdx->azColl[iVar25] = "BINARY";
    iVar13 = pParse->nTab;
    pParse->nTab = iVar13 + 1;
    pLevel->iIdxCur = iVar13;
    iVar18 = 0;
    sqlite3VdbeAddOp3(p,0x70,iVar13,iVar12 + uVar28,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    pSVar8 = pWC->pWInfo->pTabList;
    bVar4 = pLevel->iFrom;
    if ((pSVar8->a[bVar4].fg.field_0x1 & 0x10) == 0) {
      iVar12 = pLevel->iTabCur;
      iVar13 = 0x24;
    }
    else {
      iVar12 = pSVar8->a[bVar4].regReturn;
      iVar18 = sqlite3VdbeAddOp3(p,0x46,0,0,0);
      sqlite3VdbeAddOp3(p,0xd,iVar12,0,pSVar8->a[bVar4].addrFillSub);
      iVar13 = 0xe;
    }
    iVar12 = sqlite3VdbeAddOp3(p,iVar13,iVar12,0,0);
    if (local_b8 == (Expr *)0x0) {
      iVar13 = 0;
    }
    else {
      iVar13 = pParse->nLabel + -1;
      pParse->nLabel = iVar13;
      sqlite3ExprIfFalse(pParse,local_b8,iVar13,0x10);
      pbVar2 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar2 = *pbVar2 | 2;
    }
    if (pParse->nTempReg == '\0') {
      regOut = pParse->nMem + 1;
      pParse->nMem = regOut;
    }
    else {
      bVar10 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar10;
      regOut = pParse->aTempReg[bVar10];
    }
    iVar14 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,regOut,0,(int *)0x0,(Index *)0x0,0)
    ;
    sqlite3VdbeAddOp3(p,0x84,pLevel->iIdxCur,regOut,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_b8 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar13);
    }
    if ((pSVar8->a[bVar4].fg.field_0x1 & 0x10) == 0) {
      sqlite3VdbeAddOp3(p,5,pLevel->iTabCur,iVar12 + 1,0);
    }
    else {
      if (iVar18 < 0) {
        iVar18 = p->nOp + -1;
      }
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + iVar18;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = iVar14 + iVar25;
      translateColumnToCopy(pParse,iVar12,pLevel->iTabCur,pSVar8->a[bVar4].regResult,1);
      sqlite3VdbeAddOp3(p,0xb,0,iVar12,0);
      puVar3 = &pSVar8->a[bVar4].fg.field_0x1;
      *puVar3 = *puVar3 & 0xef;
    }
    iVar13 = p->nOp;
    if (0 < (long)iVar13) {
      p->aOp[(long)iVar13 + -1].p5 = 3;
    }
    uVar5 = p->db->mallocFailed;
    if (uVar5 == '\0') {
      iVar18 = iVar13 + -1;
      if (-1 < iVar12) {
        iVar18 = iVar12;
      }
      pOVar21 = p->aOp + iVar18;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = iVar13;
    if (regOut != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = regOut;
        iVar13 = p->nOp;
      }
    }
    if (uVar5 == '\0') {
      iVar12 = iVar13 + -1;
      if (-1 < iVar11) {
        iVar12 = iVar11;
      }
      pOVar21 = p->aOp + iVar12;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = iVar13;
  }
LAB_00180031:
  if (local_b8 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_b8);
  }
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}